

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::getLowerUnscaled(SPxLPBase<double> *this,VectorBase<double> *vec)

{
  pointer pdVar1;
  undefined8 in_RSI;
  VectorBase<double> *in_RDI;
  VectorBase<double> *vec_00;
  VectorBase<double> local_28;
  
  if (((ulong)in_RDI[0x11].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish & 1) == 0) {
    LPColSetBase<double>::lower
              ((LPColSetBase<double> *)
               &in_RDI[8].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish);
    vec_00 = &local_28;
    VectorBase<double>::VectorBase(in_RDI,vec_00);
    VectorBase<double>::operator=(in_RDI,vec_00);
    VectorBase<double>::~VectorBase((VectorBase<double> *)0x485499);
  }
  else {
    pdVar1 = in_RDI[0x11].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (**(code **)((long)*pdVar1 + 0xb8))(pdVar1,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void SPxLPBase<R>::getLowerUnscaled(VectorBase<R>& vec) const
{
   if(_isScaled)
      lp_scaler->getLowerUnscaled(*this, vec);
   else
      vec = VectorBase<R>(LPColSetBase<R>::lower());
}